

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O1

bool __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
::searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
           *this,KNNResultSet<double,_unsigned_long,_unsigned_long> *result_set,ElementType *vec,
          NodePtr node,DistanceType mindistsq,distance_vector_t *dists,float epsError)

{
  ulong uVar1;
  int iVar2;
  NodePtr pNVar3;
  DistanceType *pDVar4;
  long lVar5;
  long lVar6;
  IndexType *pIVar7;
  IndexType IVar8;
  IndexType *pIVar9;
  double dVar10;
  NodePtr node_00;
  bool bVar11;
  CountType CVar12;
  size_t i;
  long lVar13;
  NodePtr node_01;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  pNVar3 = node->child1;
  if ((pNVar3 == (NodePtr)0x0) && (node->child2 == (Node *)0x0)) {
    uVar15 = (node->node_type).lr.left;
    bVar11 = (node->node_type).lr.right <= uVar15;
    if (!bVar11) {
      pDVar4 = result_set->dists;
      dVar10 = pDVar4[result_set->capacity - 1];
      lVar5 = *(long *)this;
      lVar6 = *(long *)**(undefined8 **)(this + 0xa8);
      pIVar7 = result_set->indices;
      do {
        IVar8 = *(IndexType *)(lVar5 + uVar15 * 8);
        dVar16 = 0.0;
        lVar13 = 0;
        do {
          dVar17 = vec[lVar13] - *(double *)(lVar6 + IVar8 * 0x28 + 0x10 + lVar13 * 8);
          dVar16 = dVar16 + dVar17 * dVar17;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        if (dVar16 < dVar10) {
          CVar12 = result_set->count;
          if (CVar12 != 0) {
            pIVar9 = result_set->indices;
            do {
              if (pDVar4[CVar12 - 1] <= dVar16) goto LAB_0020891f;
              uVar1 = CVar12 - 1;
              if (CVar12 < result_set->capacity) {
                pDVar4[CVar12] = pDVar4[CVar12 - 1];
                pIVar9[CVar12] = pIVar9[uVar1];
              }
              CVar12 = uVar1;
            } while (uVar1 != 0);
            CVar12 = 0;
          }
LAB_0020891f:
          if (CVar12 < result_set->capacity) {
            pDVar4[CVar12] = dVar16;
            pIVar7[CVar12] = IVar8;
          }
          if (result_set->count < result_set->capacity) {
            result_set->count = result_set->count + 1;
          }
        }
        uVar15 = uVar15 + 1;
        bVar14 = uVar15 < (node->node_type).lr.right;
        bVar11 = !bVar14;
      } while (bVar14);
    }
  }
  else {
    iVar2 = (node->node_type).sub.divfeat;
    dVar10 = vec[iVar2] - (node->node_type).sub.divlow;
    dVar16 = vec[iVar2] - (node->node_type).sub.divhigh;
    node_01 = pNVar3;
    node_00 = node->child2;
    if (dVar10 + dVar16 < 0.0) {
      node_01 = node->child2;
      node_00 = pNVar3;
    }
    bVar11 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                       (this,result_set,vec,node_00,mindistsq,dists,epsError);
    if (bVar11) {
      uVar15 = -(ulong)(dVar10 + dVar16 < 0.0);
      dVar16 = (double)(~uVar15 & (ulong)(dVar10 * dVar10) | (ulong)(dVar16 * dVar16) & uVar15);
      dVar10 = dists->_M_elems[iVar2];
      dVar17 = (mindistsq + dVar16) - dVar10;
      dists->_M_elems[iVar2] = dVar16;
      if ((result_set->dists[result_set->capacity - 1] < (double)epsError * dVar17) ||
         (bVar11 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                             (this,result_set,vec,node_01,dVar17,dists,epsError), bVar11)) {
        dists->_M_elems[iVar2] = dVar10;
        return true;
      }
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool searchLevel(RESULTSET &result_set, const ElementType *vec,
                   const NodePtr node, DistanceType mindistsq,
                   distance_vector_t &dists, const float epsError) const {
    /* If this is a leaf node, then do check and return. */
    if ((node->child1 == NULL) && (node->child2 == NULL)) {
      // count_leaf += (node->lr.right-node->lr.left);  // Removed since was
      // neither used nor returned to the user.
      DistanceType worst_dist = result_set.worstDist();
      for (IndexType i = node->node_type.lr.left; i < node->node_type.lr.right;
           ++i) {
        const IndexType index = BaseClassRef::vind[i]; // reorder... : i;
        DistanceType dist = distance.evalMetric(
            vec, index, (DIM > 0 ? DIM : BaseClassRef::dim));
        if (dist < worst_dist) {
          if (!result_set.addPoint(dist, BaseClassRef::vind[i])) {
            // the resultset doesn't want to receive any more points, we're done
            // searching!
            return false;
          }
        }
      }
      return true;
    }

    /* Which child branch should be taken first? */
    int idx = node->node_type.sub.divfeat;
    ElementType val = vec[idx];
    DistanceType diff1 = val - node->node_type.sub.divlow;
    DistanceType diff2 = val - node->node_type.sub.divhigh;

    NodePtr bestChild;
    NodePtr otherChild;
    DistanceType cut_dist;
    if ((diff1 + diff2) < 0) {
      bestChild = node->child1;
      otherChild = node->child2;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divhigh, idx);
    } else {
      bestChild = node->child2;
      otherChild = node->child1;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divlow, idx);
    }

    /* Call recursively to search next level down. */
    if (!searchLevel(result_set, vec, bestChild, mindistsq, dists, epsError)) {
      // the resultset doesn't want to receive any more points, we're done
      // searching!
      return false;
    }

    DistanceType dst = dists[idx];
    mindistsq = mindistsq + cut_dist - dst;
    dists[idx] = cut_dist;
    if (mindistsq * epsError <= result_set.worstDist()) {
      if (!searchLevel(result_set, vec, otherChild, mindistsq, dists,
                       epsError)) {
        // the resultset doesn't want to receive any more points, we're done
        // searching!
        return false;
      }
    }
    dists[idx] = dst;
    return true;
  }